

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUVProcessChain.cxx
# Opt level: O0

bool testUVProcessChainExternalLoop(char *helperCommand)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  __shared_count<(__gnu_cxx::_Lock_policy)2> __s;
  bool bVar1;
  int fd;
  cmUVProcessChainBuilder *pcVar2;
  uv_loop_t *puVar3;
  uv_loop_t *puVar4;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_330;
  undefined1 local_2d8 [8];
  string output;
  cmUVPipeIStream stream;
  cmUVProcessChain chain;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  iterator local_c0;
  size_type local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  undefined1 local_98 [8];
  cmUVProcessChainBuilder builder;
  undefined1 local_28 [8];
  uv_loop_ptr loop;
  char *helperCommand_local;
  
  loop.loop.super___shared_ptr<uv_loop_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)helperCommand;
  cm::uv_loop_ptr::uv_loop_ptr((uv_loop_ptr *)local_28);
  cm::uv_loop_ptr::init((uv_loop_ptr *)local_28,(EVP_PKEY_CTX *)0x0);
  cmUVProcessChainBuilder::cmUVProcessChainBuilder((cmUVProcessChainBuilder *)local_98);
  __s = loop.loop.super___shared_ptr<uv_loop_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  chain.Data._M_t.
  super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
  .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false>._M_head_impl._5_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,(char *)__s._M_pi,
             (allocator<char> *)
             ((long)&chain.Data._M_t.
                     super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
                     .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false> + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"echo",
             (allocator<char> *)
             ((long)&chain.Data._M_t.
                     super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
                     .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false> + 6));
  chain.Data._M_t.
  super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
  .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false>._M_head_impl._5_1_ = 0;
  local_c0 = &local_100;
  local_b8 = 2;
  this = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)((long)&chain.Data._M_t.
                    super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
                    .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false> + 4);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this);
  __l._M_len = local_b8;
  __l._M_array = local_c0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_b0,__l,this);
  pcVar2 = cmUVProcessChainBuilder::AddCommand((cmUVProcessChainBuilder *)local_98,&local_b0);
  pcVar2 = cmUVProcessChainBuilder::SetBuiltinStream(pcVar2,Stream_OUTPUT);
  puVar3 = cm::uv_loop_ptr::operator*((uv_loop_ptr *)local_28);
  cmUVProcessChainBuilder::SetExternalLoop(pcVar2,puVar3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&chain.Data._M_t.
                        super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
                        .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false> + 4));
  local_330 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0;
  do {
    local_330 = local_330 + -1;
    std::__cxx11::string::~string((string *)local_330);
  } while (local_330 != &local_100);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&chain.Data._M_t.
                     super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
                     .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false> + 6));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&chain.Data._M_t.
                     super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
                     .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false> + 7));
  puVar3 = cmUVProcessChainBuilder::GetLoop((cmUVProcessChainBuilder *)local_98);
  puVar4 = cm::uv_loop_ptr::operator_cast_to_uv_loop_s_((uv_loop_ptr *)local_28);
  if (puVar3 == puVar4) {
    cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)&stream.field_0x198);
    puVar3 = cmUVProcessChain::GetLoop((cmUVProcessChain *)&stream.field_0x198);
    puVar4 = cm::uv_loop_ptr::operator_cast_to_uv_loop_s_((uv_loop_ptr *)local_28);
    if (puVar3 == puVar4) {
      bVar1 = cmUVProcessChain::Wait((cmUVProcessChain *)&stream.field_0x198,0);
      if (bVar1) {
        puVar3 = cmUVProcessChain::GetLoop((cmUVProcessChain *)&stream.field_0x198);
        fd = cmUVProcessChain::OutputStream((cmUVProcessChain *)&stream.field_0x198);
        cmBasicUVPipeIStream<char,_std::char_traits<char>_>::cmBasicUVPipeIStream
                  ((cmBasicUVPipeIStream<char,_std::char_traits<char>_> *)
                   ((long)&output.field_2 + 8),puVar3,fd);
        getInput_abi_cxx11_((string *)local_2d8,(istream *)((long)&output.field_2 + 8));
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_2d8,"HELLO world!");
        if (bVar1) {
          poVar5 = std::operator<<((ostream *)&std::cout,"Output was \"");
          poVar5 = std::operator<<(poVar5,(string *)local_2d8);
          poVar5 = std::operator<<(poVar5,"\", expected \"HELLO world!\"");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        helperCommand_local._7_1_ = !bVar1;
        chain.Data._M_t.
        super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
        ._M_t.
        super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
        .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false>._M_head_impl._0_4_ = 1;
        std::__cxx11::string::~string((string *)local_2d8);
        cmBasicUVPipeIStream<char,_std::char_traits<char>_>::~cmBasicUVPipeIStream
                  ((cmBasicUVPipeIStream<char,_std::char_traits<char>_> *)
                   ((long)&output.field_2 + 8));
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,"Wait() timed out");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        helperCommand_local._7_1_ = false;
        chain.Data._M_t.
        super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
        ._M_t.
        super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
        .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false>._M_head_impl._0_4_ = 1;
      }
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,"GetLoop() should return external loop");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      helperCommand_local._7_1_ = false;
      chain.Data._M_t.
      super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
      .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false>._M_head_impl._0_4_ = 1;
    }
    cmUVProcessChain::~cmUVProcessChain((cmUVProcessChain *)&stream.field_0x198);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,"GetLoop() should return external loop");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    helperCommand_local._7_1_ = false;
    chain.Data._M_t.
    super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
    .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false>._M_head_impl._0_4_ = 1;
  }
  cmUVProcessChainBuilder::~cmUVProcessChainBuilder((cmUVProcessChainBuilder *)local_98);
  cm::uv_loop_ptr::~uv_loop_ptr((uv_loop_ptr *)local_28);
  return helperCommand_local._7_1_;
}

Assistant:

bool testUVProcessChainExternalLoop(const char* helperCommand)
{
  cm::uv_loop_ptr loop;
  loop.init();

  cmUVProcessChainBuilder builder;
  builder.AddCommand({ helperCommand, "echo" })
    .SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT)
    .SetExternalLoop(*loop);
  if (builder.GetLoop() != loop) {
    std::cout << "GetLoop() should return external loop" << std::endl;
    return false;
  }

  auto chain = builder.Start();

  if (&chain.GetLoop() != loop) {
    std::cout << "GetLoop() should return external loop" << std::endl;
    return false;
  }

  if (!chain.Wait()) {
    std::cout << "Wait() timed out" << std::endl;
    return false;
  }

  cmUVPipeIStream stream(chain.GetLoop(), chain.OutputStream());
  std::string output = getInput(stream);
  if (output != "HELLO world!") {
    std::cout << "Output was \"" << output << "\", expected \"HELLO world!\""
              << std::endl;
    return false;
  }

  return true;
}